

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

UdpPortDeclSyntax * __thiscall slang::parsing::Parser::parseUdpPortDecl(Parser *this,bool *isReg)

{
  Token identifier;
  Token equals_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token reg_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_00;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements_01;
  Token keyword;
  Token keyword_00;
  Token name_00;
  bool bVar1;
  bool bVar2;
  EVP_PKEY_CTX *src;
  undefined1 *in_RSI;
  undefined8 *in_RDI;
  Token TVar3;
  Token name_1;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> ports;
  Token input;
  Token equals;
  EqualsValueClauseSyntax *init;
  Token name;
  Token reg;
  Token output;
  AttrList attrs;
  undefined6 in_stack_fffffffffffffcc8;
  TokenKind in_stack_fffffffffffffcce;
  undefined4 in_stack_fffffffffffffcd0;
  uint32_t in_stack_fffffffffffffcd4;
  undefined6 in_stack_fffffffffffffcd8;
  TokenKind in_stack_fffffffffffffcde;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffce0;
  undefined8 in_stack_fffffffffffffce8;
  ParserBase *in_stack_fffffffffffffcf0;
  undefined8 in_stack_fffffffffffffd00;
  Info *in_stack_fffffffffffffd08;
  EqualsValueClauseSyntax *in_stack_fffffffffffffd10;
  TokenKind kind;
  ParserBase *in_stack_fffffffffffffd60;
  TokenKind local_1d8;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_180 [2];
  Parser *local_108;
  EqualsValueClauseSyntax *local_60;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_58;
  Info *local_50;
  UdpInputPortDeclSyntax *local_8;
  
  parseAttributes(local_108);
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffce0._M_extent_value,
                           in_stack_fffffffffffffcde);
  if ((bVar1) ||
     (bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffce0._M_extent_value,
                               in_stack_fffffffffffffcde), bVar1)) {
    kind = (TokenKind)((ulong)in_RDI >> 0x30);
    ParserBase::consumeIf
              ((ParserBase *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               in_stack_fffffffffffffcce);
    ParserBase::consumeIf
              ((ParserBase *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               in_stack_fffffffffffffcce);
    TVar3 = ParserBase::expect(in_stack_fffffffffffffd60,kind);
    bVar1 = Token::operator_cast_to_bool((Token *)0x319a50);
    if (bVar1) {
      *in_RSI = 1;
    }
    local_60 = (EqualsValueClauseSyntax *)0x0;
    bVar1 = Token::operator_cast_to_bool((Token *)0x319a7a);
    if (((bVar1) && (bVar1 = Token::operator_cast_to_bool((Token *)0x319a90), bVar1)) &&
       (bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffce0._M_extent_value,
                                 in_stack_fffffffffffffcde), bVar1)) {
      ParserBase::consume(in_stack_fffffffffffffcf0);
      parseExpression((Parser *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
      equals_00.rawLen._2_2_ = in_stack_fffffffffffffcde;
      equals_00._0_6_ = in_stack_fffffffffffffcd8;
      equals_00.info = (Info *)in_stack_fffffffffffffce0._M_extent_value;
      local_60 = slang::syntax::SyntaxFactory::equalsValueClause
                           ((SyntaxFactory *)
                            CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),equals_00,
                            (ExpressionSyntax *)
                            CONCAT26(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8));
    }
    elements._M_ptr._6_2_ = in_stack_fffffffffffffcde;
    elements._M_ptr._0_6_ = in_stack_fffffffffffffcd8;
    elements._M_extent._M_extent_value = in_stack_fffffffffffffce0._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),elements);
    local_58 = TVar3._0_8_;
    local_50 = TVar3.info;
    keyword_00.info = (Info *)in_stack_fffffffffffffcf0;
    keyword_00.kind = (short)in_stack_fffffffffffffce8;
    keyword_00._2_1_ = (char)((ulong)in_stack_fffffffffffffce8 >> 0x10);
    keyword_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffce8 >> 0x18);
    keyword_00.rawLen = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
    reg_00.info = (Info *)in_stack_fffffffffffffce0._M_extent_value;
    reg_00._0_8_ = local_60;
    name_00.info = in_stack_fffffffffffffd08;
    name_00.kind = (short)in_stack_fffffffffffffd00;
    name_00._2_1_ = (char)((ulong)in_stack_fffffffffffffd00 >> 0x10);
    name_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffd00 >> 0x18);
    name_00.rawLen = (int)((ulong)in_stack_fffffffffffffd00 >> 0x20);
    local_8 = (UdpInputPortDeclSyntax *)
              slang::syntax::SyntaxFactory::udpOutputPortDecl
                        ((SyntaxFactory *)local_50,local_58,keyword_00,reg_00,name_00,
                         in_stack_fffffffffffffd10);
  }
  else {
    _local_108 = ParserBase::expect(in_stack_fffffffffffffd60,(TokenKind)((ulong)in_RDI >> 0x30));
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x319c80);
    while( true ) {
      ParserBase::expect(in_stack_fffffffffffffd60,(TokenKind)((ulong)in_RDI >> 0x30));
      identifier.rawLen._2_2_ = in_stack_fffffffffffffcce;
      identifier._0_6_ = in_stack_fffffffffffffcc8;
      identifier.info._0_4_ = in_stack_fffffffffffffcd0;
      identifier.info._4_4_ = in_stack_fffffffffffffcd4;
      slang::syntax::SyntaxFactory::identifierName((SyntaxFactory *)0x319cee,identifier);
      slang::syntax::TokenOrSyntax::TokenOrSyntax
                ((TokenOrSyntax *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 (SyntaxNode *)CONCAT26(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8));
      SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)
                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 (TokenOrSyntax *)CONCAT26(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8));
      bVar2 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffce0._M_extent_value,
                               in_stack_fffffffffffffcde);
      bVar1 = true;
      if (bVar2) {
        TVar3 = ParserBase::peek((ParserBase *)
                                 CONCAT26(in_stack_fffffffffffffcde,in_stack_fffffffffffffcd8),
                                 in_stack_fffffffffffffcd4);
        local_1d8 = TVar3.kind;
        bVar1 = local_1d8 != Identifier;
      }
      if (bVar1) break;
      ParserBase::consume(in_stack_fffffffffffffcf0);
      TVar3.rawLen._2_2_ = in_stack_fffffffffffffcde;
      TVar3._0_6_ = in_stack_fffffffffffffcd8;
      TVar3.info = (Info *)in_stack_fffffffffffffce0._M_extent_value;
      slang::syntax::TokenOrSyntax::TokenOrSyntax
                ((TokenOrSyntax *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 TVar3);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)
                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 (TokenOrSyntax *)CONCAT26(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8));
    }
    elements_00._M_ptr._6_2_ = in_stack_fffffffffffffcde;
    elements_00._M_ptr._0_6_ = in_stack_fffffffffffffcd8;
    elements_00._M_extent._M_extent_value = in_stack_fffffffffffffce0._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),elements_00);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::copy(local_180,(EVP_PKEY_CTX *)*in_RDI,src);
    elements_01._M_ptr._6_2_ = in_stack_fffffffffffffcde;
    elements_01._M_ptr._0_6_ = in_stack_fffffffffffffcd8;
    elements_01._M_extent._M_extent_value = in_stack_fffffffffffffce0._M_extent_value;
    slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::SeparatedSyntaxList
              ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)
               CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),elements_01);
    keyword.rawLen._2_2_ = in_stack_fffffffffffffcde;
    keyword._0_6_ = in_stack_fffffffffffffcd8;
    keyword.info = (Info *)in_stack_fffffffffffffce0._M_extent_value;
    local_8 = slang::syntax::SyntaxFactory::udpInputPortDecl
                        ((SyntaxFactory *)
                         CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                         CONCAT26(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8),keyword,
                         (SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)0x319f0d);
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x319f2e);
  }
  return &local_8->super_UdpPortDeclSyntax;
}

Assistant:

UdpPortDeclSyntax& Parser::parseUdpPortDecl(bool& isReg) {
    auto attrs = parseAttributes();

    if (peek(TokenKind::OutputKeyword) || peek(TokenKind::RegKeyword)) {
        auto output = consumeIf(TokenKind::OutputKeyword);
        auto reg = consumeIf(TokenKind::RegKeyword);
        auto name = expect(TokenKind::Identifier);

        if (reg)
            isReg = true;

        EqualsValueClauseSyntax* init = nullptr;
        if (output && reg && peek(TokenKind::Equals)) {
            auto equals = consume();
            init = &factory.equalsValueClause(equals, parseExpression());
        }

        return factory.udpOutputPortDecl(attrs, output, reg, name, init);
    }

    auto input = expect(TokenKind::InputKeyword);

    SmallVector<TokenOrSyntax, 4> ports;
    while (true) {
        auto name = expect(TokenKind::Identifier);
        ports.push_back(&factory.identifierName(name));

        if (!peek(TokenKind::Comma) || peek(1).kind != TokenKind::Identifier)
            break;

        ports.push_back(consume());
    }

    return factory.udpInputPortDecl(attrs, input, ports.copy(alloc));
}